

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

bool __thiscall Catch::WildcardPattern::matches(WildcardPattern *this,string *str)

{
  long lVar1;
  long lVar2;
  int iVar3;
  size_type sVar4;
  ulong uVar5;
  long lVar6;
  pointer pcVar7;
  bool bVar8;
  string local_60;
  ReusableStringStream local_40;
  SourceLineInfo local_28;
  
  switch(this->m_wildcard) {
  case NoWildcard:
    normaliseString(&local_60,this,str);
    uVar5 = (this->m_pattern)._M_string_length;
    if (uVar5 == local_60._M_string_length) {
      if (uVar5 != 0) {
        pcVar7 = (this->m_pattern)._M_dataplus._M_p;
LAB_0016b4cc:
        iVar3 = bcmp(pcVar7,local_60._M_dataplus._M_p,uVar5);
        bVar8 = iVar3 == 0;
        goto LAB_0016b584;
      }
LAB_0016b5a2:
      bVar8 = true;
      goto LAB_0016b584;
    }
    break;
  case WildcardAtStart:
    normaliseString(&local_60,this,str);
    uVar5 = (this->m_pattern)._M_string_length;
    if (uVar5 <= local_60._M_string_length) {
      bVar8 = uVar5 == 0;
      if (bVar8) goto LAB_0016b584;
      pcVar7 = (this->m_pattern)._M_dataplus._M_p;
      if (pcVar7[uVar5 - 1] == local_60._M_dataplus._M_p[local_60._M_string_length - 1]) {
        lVar6 = 0;
        do {
          bVar8 = 1 - uVar5 == lVar6;
          if (bVar8) goto LAB_0016b584;
          lVar2 = lVar6 + (uVar5 - 2);
          lVar1 = lVar6 + (local_60._M_string_length - 2);
          lVar6 = lVar6 + -1;
        } while (pcVar7[lVar2] == local_60._M_dataplus._M_p[lVar1]);
      }
    }
    break;
  case WildcardAtEnd:
    normaliseString(&local_60,this,str);
    uVar5 = (this->m_pattern)._M_string_length;
    if (uVar5 <= local_60._M_string_length) {
      if (uVar5 != 0) {
        pcVar7 = (this->m_pattern)._M_dataplus._M_p;
        goto LAB_0016b4cc;
      }
      goto LAB_0016b5a2;
    }
    break;
  case WildcardAtBothEnds:
    normaliseString(&local_60,this,str);
    sVar4 = clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            find(&local_60,(this->m_pattern)._M_dataplus._M_p,0,(this->m_pattern)._M_string_length);
    bVar8 = sVar4 != 0xffffffffffffffff;
    goto LAB_0016b584;
  default:
    ReusableStringStream::ReusableStringStream(&local_40);
    local_28.file =
         "/workspace/llm4binary/github/license_c_cmakelists/cormacc[P]va_args_iterators/vendor/catch/catch.hpp"
    ;
    local_28.line = 0x3c46;
    operator<<(local_40.m_oss,&local_28);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_40.m_oss,": Internal Catch2 error: ",0x19);
    std::__ostream_insert<char,std::char_traits<char>>(local_40.m_oss,"Unknown enum",0xc);
    std::__cxx11::stringbuf::str();
    throw_logic_error(&local_60);
  }
  bVar8 = false;
LAB_0016b584:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  return bVar8;
}

Assistant:

bool WildcardPattern::matches( std::string const& str ) const {
        switch( m_wildcard ) {
            case NoWildcard:
                return m_pattern == normaliseString( str );
            case WildcardAtStart:
                return endsWith( normaliseString( str ), m_pattern );
            case WildcardAtEnd:
                return startsWith( normaliseString( str ), m_pattern );
            case WildcardAtBothEnds:
                return contains( normaliseString( str ), m_pattern );
            default:
                CATCH_INTERNAL_ERROR( "Unknown enum" );
        }
    }